

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvp_fe_tests.cc
# Opt level: O0

void __thiscall
lf::uscalfe::test::lfe_bvpfe_bvp_DirNeu_Test::~lfe_bvpfe_bvp_DirNeu_Test
          (lfe_bvpfe_bvp_DirNeu_Test *this)

{
  lfe_bvpfe_bvp_DirNeu_Test *this_local;
  
  ~lfe_bvpfe_bvp_DirNeu_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lfe_bvpfe, bvp_DirNeu) {
  std::cout << "Test: Solving general elliptic BVP on unit square" << std::endl;
  // Set debugging flags
  // LFELinSys_ctrl = 0;
  // The solution and its gradient
  auto u = mesh::utils::MeshFunctionGlobal([](Eigen::Vector2d x) -> double {
    return (0.5 * std::log(x.squaredNorm() + 1.0));
  });
  auto grad_u =
      mesh::utils::MeshFunctionGlobal([](Eigen::Vector2d x) -> Eigen::Vector2d {
        return (1.0 / (x.squaredNorm() + 1.0)) * x;
      });
  auto bvp_p = std::make_shared<MixedEllipticBVP>();
  auto errnorms = TestConvergenceEllBVPFESol(REFLEV, bvp_p, u, grad_u);

  std::array<double, 8> exp_l2err{0.025494,    0.00736786,  0.0019407,
                                  0.000493379, 0.000123978, 3.10413e-05,
                                  7.76373e-06, 1.94118e-06};
  std::array<double, 8> exp_h1serr{0.104398,   0.0565337,  0.0290143,
                                   0.014624,   0.00732936, 0.00366718,
                                   0.00183394, 0.00091702};

  int k = 0;
  // TODO(ralfh) : Comparing the L2 Norm to a reference value is not really
  // meaningful, e.g. if we increase the local quadrature order with which the
  // error is computed, this test fails!
  for (auto& err : errnorms) {
    if (k < 8) {
      EXPECT_NEAR(err.first, exp_l2err[k], 1.0E-5)
          << "Dubious L2 norm on level " << k;
      EXPECT_NEAR(err.second, exp_h1serr[k], 1.0E-5)
          << "Dubious H1 norm on level " << k;
      k++;
    }
  }
}